

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void ns_broadcast(ns_mgr *mgr,ns_callback_t cb,void *data,size_t len)

{
  int __fd;
  ctl_msg ctl_msg;
  size_t local_2028;
  ns_callback_t local_2020;
  undefined1 local_2018 [8192];
  
  if (((len < 0x2000) && (data != (void *)0x0)) && (__fd = mgr->ctl[0], __fd != -1)) {
    local_2028 = len;
    local_2020 = cb;
    memcpy(local_2018,data,len);
    send(__fd,&local_2020,len + 8,0);
    recv(mgr->ctl[0],&local_2028,1,0);
  }
  return;
}

Assistant:

void ns_broadcast(struct ns_mgr *mgr, ns_callback_t cb,void *data, size_t len) {
  struct ctl_msg ctl_msg;
  if (mgr->ctl[0] != INVALID_SOCKET && data != NULL &&
      len < sizeof(ctl_msg.message)) {
    ctl_msg.callback = cb;
    memcpy(ctl_msg.message, data, len);
    send(mgr->ctl[0], (char *) &ctl_msg,
         offsetof(struct ctl_msg, message) + len, 0);
    recv(mgr->ctl[0], (char *) &len, 1, 0);
  }
}